

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExport(WatWriter *this,Export *export_)

{
  bool bVar1;
  char *name;
  string_view local_28;
  Export *local_18;
  Export *export__local;
  WatWriter *this_local;
  
  local_18 = export_;
  export__local = (Export *)this;
  if (((this->options_->inline_export & 1U) == 0) || (bVar1 = IsInlineExport(this,export_), !bVar1))
  {
    WriteOpenSpace(this,"export");
    string_view::string_view(&local_28,&local_18->name);
    WriteQuotedString(this,local_28,Space);
    name = GetKindName(local_18->kind);
    WriteOpenSpace(this,name);
    WriteVar(this,&local_18->var,Space);
    WriteCloseSpace(this);
    WriteCloseNewline(this);
  }
  return;
}

Assistant:

void WatWriter::WriteExport(const Export& export_) {
  if (options_.inline_export && IsInlineExport(export_)) {
    return;
  }
  WriteOpenSpace("export");
  WriteQuotedString(export_.name, NextChar::Space);
  WriteOpenSpace(GetKindName(export_.kind));
  WriteVar(export_.var, NextChar::Space);
  WriteCloseSpace();
  WriteCloseNewline();
}